

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O2

void crash_and_recover_with_num_keeping_test(void)

{
  FILE *pFVar1;
  fdb_kvs_handle *pfVar2;
  fdb_seqnum_t seqnum;
  fdb_status fVar3;
  sb_decision_t sVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_seqnum_t local_4e8;
  fdb_kvs_handle *snap_db;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_kvs_info kvs_info;
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [512];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fconfig.compaction_threshold = '\0';
  fconfig.block_reusing_threshold = 0x41;
  fconfig.num_keeping_headers = 10;
  system("rm -rf  staleblktest* > errorlog.txt");
  fdb_open(&dbfile,"./staleblktest1file.1",&fconfig);
  fdb_kvs_open(dbfile,&db,"./staleblktest1",&kvs_config);
  iVar9 = 1;
  uVar10 = 0;
  while (uVar10 != 0xb) {
    sprintf(keybuf,"%dkey",(ulong)uVar10);
    fillstr(bodybuf,'b',0x200);
    pfVar2 = db;
    sVar6 = strlen(keybuf);
    sVar7 = strlen(bodybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar6,bodybuf,sVar7);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar8 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x42f);
      crash_and_recover_with_num_keeping_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x42f,"void crash_and_recover_with_num_keeping_test()");
    }
    fVar3 = fdb_commit(dbfile,'\x01');
    pFVar1 = _stderr;
    uVar10 = uVar10 + 1;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar8 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x431);
      crash_and_recover_with_num_keeping_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x431,"void crash_and_recover_with_num_keeping_test()");
    }
  }
  do {
    builtin_strncpy(keybuf,"0key",5);
    fillstr(bodybuf,'c',0x80);
    pfVar2 = db;
    sVar6 = strlen(keybuf);
    sVar7 = strlen(bodybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar6,bodybuf,sVar7);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar8 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x43b);
      crash_and_recover_with_num_keeping_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x43b,"void crash_and_recover_with_num_keeping_test()");
    }
    fVar3 = fdb_get_file_info(dbfile,&file_info);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar8 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x43e);
      crash_and_recover_with_num_keeping_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x43e,"void crash_and_recover_with_num_keeping_test()");
    }
    iVar9 = iVar9 + 1;
  } while (file_info.file_size < 0x1000000);
  sVar4 = sb_check_block_reusing(db);
  if (sVar4 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x444);
    crash_and_recover_with_num_keeping_test()::__test_pass = 1;
    __assert_fail("sb_decision == SBD_RECLAIM",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x444,"void crash_and_recover_with_num_keeping_test()");
  }
  fVar3 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_get_kvs_info(db,&kvs_info);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar8 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x449);
      crash_and_recover_with_num_keeping_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x449,"void crash_and_recover_with_num_keeping_test()");
    }
    local_4e8 = kvs_info.last_seqnum;
    uVar10 = 0;
    while (uVar10 != 10) {
      sprintf(keybuf,"%dkey",(ulong)uVar10);
      fillstr(bodybuf,'d',0x40);
      pfVar2 = db;
      sVar6 = strlen(keybuf);
      sVar7 = strlen(bodybuf);
      fVar3 = fdb_set_kv(pfVar2,keybuf,sVar6,bodybuf,sVar7);
      pFVar1 = _stderr;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar8 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x452);
        crash_and_recover_with_num_keeping_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x452,"void crash_and_recover_with_num_keeping_test()");
      }
      fVar3 = fdb_commit(dbfile,'\x01');
      pFVar1 = _stderr;
      uVar10 = uVar10 + 1;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar8 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x454);
        crash_and_recover_with_num_keeping_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x454,"void crash_and_recover_with_num_keeping_test()");
      }
    }
    fVar3 = fdb_kvs_close(db);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar8 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x459);
      crash_and_recover_with_num_keeping_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x459,"void crash_and_recover_with_num_keeping_test()");
    }
    fVar3 = fdb_close(dbfile);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar8 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x45b);
      crash_and_recover_with_num_keeping_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x45b,"void crash_and_recover_with_num_keeping_test()");
    }
    fdb_shutdown();
    fVar3 = fdb_open(&dbfile,"./staleblktest1file.1",&fconfig);
    seqnum = local_4e8;
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar8 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x460);
      crash_and_recover_with_num_keeping_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x460,"void crash_and_recover_with_num_keeping_test()");
    }
    fdb_kvs_open(dbfile,&db,"./staleblktest1",&kvs_config);
    fVar3 = fdb_get_file_info(dbfile,&file_info);
    pFVar1 = _stderr;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      iVar5 = _disk_dump("./staleblktest1file.1",file_info.file_size,
                         (ulong)((fconfig.blocksize >> 2) + fconfig.blocksize * 2));
      if (iVar5 < 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x468);
        crash_and_recover_with_num_keeping_test()::__test_pass = 1;
        __assert_fail("r >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x468,"void crash_and_recover_with_num_keeping_test()");
      }
      fVar3 = fdb_snapshot_open(db,&snap_db,seqnum);
      pFVar1 = _stderr;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar8 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x46c);
        crash_and_recover_with_num_keeping_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x46c,"void crash_and_recover_with_num_keeping_test()");
      }
      fVar3 = fdb_rollback(&db,seqnum);
      pFVar1 = _stderr;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar8 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x470);
        crash_and_recover_with_num_keeping_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x470,"void crash_and_recover_with_num_keeping_test()");
      }
      fVar3 = fdb_compact(dbfile,"./staleblktest1file.3");
      pFVar1 = _stderr;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        uVar10 = 0;
        do {
          if (uVar10 == 0xb) {
            sVar4 = sb_check_block_reusing(db);
            if (sVar4 != SBD_NONE) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x482);
              crash_and_recover_with_num_keeping_test()::__test_pass = 1;
              __assert_fail("sb_decision == SBD_NONE",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                            ,0x482,"void crash_and_recover_with_num_keeping_test()");
            }
            while (iVar9 = iVar9 + -1, iVar9 != 0) {
              builtin_strncpy(keybuf,"0key",5);
              fillstr(bodybuf,'e',0x200);
              pfVar2 = db;
              sVar6 = strlen(keybuf);
              sVar7 = strlen(bodybuf);
              fVar3 = fdb_set_kv(pfVar2,keybuf,sVar6,bodybuf,sVar7);
              pFVar1 = _stderr;
              if (fVar3 != FDB_RESULT_SUCCESS) {
                pcVar8 = fdb_error_msg(fVar3);
                fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,
                        pcVar8,
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x48a);
                crash_and_recover_with_num_keeping_test()::__test_pass = 1;
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                              ,0x48a,"void crash_and_recover_with_num_keeping_test()");
              }
            }
            sVar4 = sb_check_block_reusing(db);
            if (sVar4 != SBD_RECLAIM) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x48d);
              crash_and_recover_with_num_keeping_test()::__test_pass = 1;
              __assert_fail("sb_decision == SBD_RECLAIM",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                            ,0x48d,"void crash_and_recover_with_num_keeping_test()");
            }
            fVar3 = fdb_kvs_close(snap_db);
            pFVar1 = _stderr;
            if (fVar3 == FDB_RESULT_SUCCESS) {
              fVar3 = fdb_kvs_close(db);
              pFVar1 = _stderr;
              if (fVar3 != FDB_RESULT_SUCCESS) {
                pcVar8 = fdb_error_msg(fVar3);
                fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,
                        pcVar8,
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x492);
                crash_and_recover_with_num_keeping_test()::__test_pass = 1;
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                              ,0x492,"void crash_and_recover_with_num_keeping_test()");
              }
              fVar3 = fdb_close(dbfile);
              pFVar1 = _stderr;
              if (fVar3 == FDB_RESULT_SUCCESS) {
                fdb_shutdown();
                memleak_end();
                pcVar8 = "%s PASSED\n";
                if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
                  pcVar8 = "%s FAILED\n";
                }
                fprintf(_stderr,pcVar8,"crash and recover with num keeping test");
                return;
              }
              pcVar8 = fdb_error_msg(fVar3);
              fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,
                      pcVar8,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x494);
              crash_and_recover_with_num_keeping_test()::__test_pass = 1;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                            ,0x494,"void crash_and_recover_with_num_keeping_test()");
            }
            pcVar8 = fdb_error_msg(fVar3);
            fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,
                    pcVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x490);
            crash_and_recover_with_num_keeping_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                          ,0x490,"void crash_and_recover_with_num_keeping_test()");
          }
          sprintf(keybuf,"%dkey",(ulong)uVar10);
          pfVar2 = db;
          sVar6 = strlen(keybuf);
          fVar3 = fdb_del_kv(pfVar2,keybuf,sVar6);
          pFVar1 = _stderr;
          if (fVar3 != FDB_RESULT_SUCCESS) {
            pcVar8 = fdb_error_msg(fVar3);
            fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,
                    pcVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x47a);
            crash_and_recover_with_num_keeping_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                          ,0x47a,"void crash_and_recover_with_num_keeping_test()");
          }
          fVar3 = fdb_commit(dbfile,'\x01');
          pFVar1 = _stderr;
          uVar10 = uVar10 + 1;
        } while (fVar3 == FDB_RESULT_SUCCESS);
        pcVar8 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x47d);
        crash_and_recover_with_num_keeping_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x47d,"void crash_and_recover_with_num_keeping_test()");
      }
      pcVar8 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x474);
      crash_and_recover_with_num_keeping_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x474,"void crash_and_recover_with_num_keeping_test()");
    }
    pcVar8 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x465);
    crash_and_recover_with_num_keeping_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x465,"void crash_and_recover_with_num_keeping_test()");
  }
  pcVar8 = fdb_error_msg(fVar3);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar8,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x447);
  crash_and_recover_with_num_keeping_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x447,"void crash_and_recover_with_num_keeping_test()");
}

Assistant:

void crash_and_recover_with_num_keeping_test() {
    TEST_INIT();
    memleak_start();

    int i, r, ndocs;
    int nheaders = 10;
    size_t last_seqno;
    char keybuf[256];
    char bodybuf[512];

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_file_info file_info;
    fdb_kvs_info kvs_info;
    sb_decision_t sb_decision;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = nheaders;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1file.1", &fconfig);
    fdb_kvs_open(dbfile, &db, "./staleblktest1", &kvs_config);

    // create num_keeping_headers+1
    for (i = 0; i < nheaders + 1; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'b', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    ndocs = i;

    // expect block reclaim
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_STATUS(status);
    last_seqno = kvs_info.last_seqnum;

    // create num_keeping_headers
    for (i = 0; i < nheaders; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'd', 64);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // preemptive shutdown
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    // reopen
    status = fdb_open(&dbfile, "./staleblktest1file.1", &fconfig);
    TEST_STATUS(status);
    fdb_kvs_open(dbfile, &db, "./staleblktest1", &kvs_config);
    TEST_STATUS(status);

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);
    r = _disk_dump("./staleblktest1file.1", file_info.file_size,
                   (2 * fconfig.blocksize) + (fconfig.blocksize / 4));
    TEST_CHK(r >= 0);

    // snapshot to last keeping header
    status = fdb_snapshot_open(db, &snap_db, last_seqno);
    TEST_STATUS(status);

    // rollback to last keepheader
    status = fdb_rollback(&db, last_seqno);
    TEST_STATUS(status);

    // manual commit
    status = fdb_compact(dbfile, "./staleblktest1file.3");
    TEST_STATUS(status);

    // delete items
    for (i = 0; i < nheaders + 1; i++) {
        sprintf(keybuf, "%dkey",i);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_STATUS(status);
        // commit
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // not reusing blocks
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_NONE);

    // append until reuse
    for (i = 0; i < ndocs; i++) {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'e', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("crash and recover with num keeping test");
}